

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-private.h
# Opt level: O3

double __thiscall Dashel::ParameterSet::get<double>(ParameterSet *this,char *key)

{
  uint *puVar1;
  const_iterator cVar2;
  long *plVar3;
  DashelException *this_00;
  double t;
  istringstream iss;
  long *local_1c8 [2];
  long local_1b8 [2];
  double local_1a8;
  key_type local_1a0 [3];
  ios_base local_128 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a0,key,(allocator<char> *)local_1c8);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)cVar2._M_node != &(this->values)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1a0,(string *)(cVar2._M_node + 2),_S_in);
    puVar1 = (uint *)((long)&local_1a0[0].field_2 +
                     *(long *)(local_1a0[0]._M_dataplus._M_p + -0x18) + 8);
    *puVar1 = *puVar1 | 1;
    std::istream::_M_extract<double>((double *)local_1a0);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
    std::ios_base::~ios_base(local_128);
    return local_1a8;
  }
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Parameter missing: ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)local_1c8);
  local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
  std::__cxx11::string::_M_construct<char*>((string *)local_1a0,*plVar3,plVar3[1] + *plVar3);
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException
            (this_00,InvalidTarget,0,local_1a0[0]._M_dataplus._M_p,(Stream *)0x0);
  __cxa_throw(this_00,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T ParameterSet::get(const char* key) const
	{
		T t;
		std::map<std::string, std::string>::const_iterator it = values.find(key);
		if (it == values.end())
		{
			std::string r = std::string("Parameter missing: ").append(key);
			throw Dashel::DashelException(DashelException::InvalidTarget, 0, r.c_str());
		}
		std::istringstream iss(it->second);
		iss >> std::boolalpha >> t;
		return t;
	}